

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O1

void __thiscall
MissingDependencyScannerTestCyclicMissingDep::Run
          (MissingDependencyScannerTestCyclicMissingDep *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  string local_58;
  string local_38;
  
  MissingDependencyScannerTest::CreateInitialState(&this->super_MissingDependencyScannerTest);
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"generated_header","");
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"compiled_object","");
  MissingDependencyScannerTest::RecordDepsLogDep
            (&this->super_MissingDependencyScannerTest,&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"compiled_object","");
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"generated_header","");
  MissingDependencyScannerTest::RecordDepsLogDep
            (&this->super_MissingDependencyScannerTest,&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  MissingDependencyScannerTest::ProcessAllNodes(&this->super_MissingDependencyScannerTest);
  bVar3 = testing::Test::Check
                    (g_current_test,
                     (this->super_MissingDependencyScannerTest).scanner_.nodes_missing_deps_._M_t.
                     _M_impl.super__Rb_tree_header._M_node_count != 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                     ,0x8e,"scanner().HadMissingDeps()");
  if ((bVar3) &&
     (bVar3 = testing::Test::Check
                        (g_current_test,
                         (this->super_MissingDependencyScannerTest).scanner_.nodes_missing_deps_.
                         _M_t._M_impl.super__Rb_tree_header._M_node_count == 2,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                         ,0x8f,"2u == scanner().nodes_missing_deps_.size()"), bVar3)) {
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (this->super_MissingDependencyScannerTest).scanner_.missing_dep_path_count_
                       == 2,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                       ,0x90,"2u == scanner().missing_dep_path_count_");
    if (bVar3) {
      MissingDependencyScannerTest::AssertMissingDependencyBetween
                (&this->super_MissingDependencyScannerTest,"compiled_object","generated_header",
                 &(this->super_MissingDependencyScannerTest).generator_rule_);
      MissingDependencyScannerTest::AssertMissingDependencyBetween
                (&this->super_MissingDependencyScannerTest,"generated_header","compiled_object",
                 &(this->super_MissingDependencyScannerTest).compile_rule_);
      return;
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(MissingDependencyScannerTest, CyclicMissingDep) {
  CreateInitialState();
  RecordDepsLogDep("generated_header", "compiled_object");
  RecordDepsLogDep("compiled_object", "generated_header");
  // In case of a cycle, both paths are reported (and there is
  // no way to fix the issue by adding deps).
  ProcessAllNodes();
  ASSERT_TRUE(scanner().HadMissingDeps());
  ASSERT_EQ(2u, scanner().nodes_missing_deps_.size());
  ASSERT_EQ(2u, scanner().missing_dep_path_count_);
  AssertMissingDependencyBetween("compiled_object", "generated_header",
                                 &generator_rule_);
  AssertMissingDependencyBetween("generated_header", "compiled_object",
                                 &compile_rule_);
}